

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_MeshFace>::Append(ON_SimpleArray<ON_MeshFace> *this,ON_MeshFace *x)

{
  undefined8 uVar1;
  int iVar2;
  ON_MeshFace *pOVar3;
  ON_MeshFace *pOVar4;
  
  iVar2 = this->m_count;
  pOVar3 = x;
  if (iVar2 == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar3 = (ON_MeshFace *)onmalloc(0x10);
      uVar1 = *(undefined8 *)(x->vi + 2);
      *(undefined8 *)pOVar3->vi = *(undefined8 *)x->vi;
      *(undefined8 *)(pOVar3->vi + 2) = uVar1;
    }
    Reserve(this,(long)iVar2);
    pOVar4 = this->m_a;
    if (pOVar4 == (ON_MeshFace *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar2 = this->m_count;
  }
  else {
    pOVar4 = this->m_a;
  }
  this->m_count = iVar2 + 1;
  uVar1 = *(undefined8 *)(pOVar3->vi + 2);
  *(undefined8 *)pOVar4[iVar2].vi = *(undefined8 *)pOVar3->vi;
  *(undefined8 *)(pOVar4[iVar2].vi + 2) = uVar1;
  if (pOVar3 != x) {
    onfree(pOVar3);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}